

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Checkbox(char *label,bool *v)

{
  ImVec2 p_max;
  bool bVar1;
  byte *in_RSI;
  float fVar2;
  float fVar3;
  float pad_1;
  ImVec2 pad;
  ImU32 check_col;
  ImRect check_bb;
  bool pressed;
  bool held;
  bool hovered;
  ImRect total_bb;
  ImVec2 pos;
  float square_sz;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  ImRect *in_stack_fffffffffffffec0;
  ImGuiID id_00;
  undefined8 in_stack_fffffffffffffec8;
  ImVec2 *in_stack_fffffffffffffed0;
  ImRect *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  ImGuiID in_stack_fffffffffffffee4;
  float fVar4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined8 in_stack_fffffffffffffef8;
  undefined1 hide_text_after_hash;
  float in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  ImU32 col;
  bool *in_stack_ffffffffffffff08;
  ImDrawList *draw_list;
  ImVec2 pos_00;
  undefined4 in_stack_ffffffffffffff18;
  undefined8 uVar5;
  float in_stack_ffffffffffffff2c;
  ImVec2 in_stack_ffffffffffffff30;
  ImVec2 local_a8;
  ImU32 local_a0;
  undefined8 in_stack_ffffffffffffff64;
  ImGuiNavHighlightFlags flags;
  ImGuiID in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  ImVec2 local_84;
  float fStack_78;
  float local_74;
  byte local_6b;
  byte local_6a;
  byte local_69;
  undefined1 local_68 [8];
  ImVec2 local_60;
  ImRect local_58;
  ImVec2 local_48;
  float local_40;
  ImVec2 local_3c;
  ImGuiID local_34;
  ImGuiStyle *local_30;
  ImGuiContext *local_28;
  ImGuiWindow *local_20;
  byte *local_18;
  bool local_1;
  
  flags = (ImGuiNavHighlightFlags)((ulong)in_stack_ffffffffffffff64 >> 0x20);
  local_18 = in_RSI;
  local_20 = GetCurrentWindow();
  if ((local_20->SkipItems & 1U) == 0) {
    local_28 = GImGui;
    local_30 = &GImGui->Style;
    uVar5 = 0;
    local_34 = ImGuiWindow::GetID((ImGuiWindow *)
                                  CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                  (char *)in_stack_fffffffffffffed8,
                                  (char *)in_stack_fffffffffffffed0);
    local_3c = CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                            (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            SUB81((ulong)in_stack_fffffffffffffed8 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffed8,0));
    fVar2 = GetFrameHeight();
    local_48 = (local_20->DC).CursorPos;
    if (local_3c.x <= 0.0) {
      fVar3 = 0.0;
    }
    else {
      fVar3 = (local_30->ItemInnerSpacing).x + local_3c.x;
    }
    fVar4 = (local_30->FramePadding).y;
    pos_00 = (ImVec2)local_68;
    local_40 = fVar2;
    ImVec2::ImVec2((ImVec2 *)pos_00,fVar2 + fVar3,fVar4 + fVar4 + local_3c.y);
    local_60 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           (ImVec2 *)0x2afd57);
    ImRect::ImRect(&local_58,&local_48,&local_60);
    ItemSize(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    id_00 = (ImGuiID)((ulong)in_stack_fffffffffffffec0 >> 0x20);
    bVar1 = ItemAdd((ImRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                    in_stack_fffffffffffffee4,in_stack_fffffffffffffed8);
    if (bVar1) {
      local_6b = ButtonBehavior((ImRect *)CONCAT44(fVar3,in_stack_ffffffffffffff18),
                                (ImGuiID)pos_00.y,in_stack_ffffffffffffff08,
                                (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                                                ),
                                (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      hide_text_after_hash = (undefined1)((ulong)in_stack_fffffffffffffef8 >> 0x38);
      if ((bool)local_6b) {
        *local_18 = (*local_18 ^ 0xff) & 1;
        MarkItemEdited(id_00);
      }
      draw_list = (ImDrawList *)&stack0xffffffffffffff74;
      ImVec2::ImVec2((ImVec2 *)draw_list,local_40,local_40);
      local_84 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                             ,(ImVec2 *)0x2afe50);
      ImRect::ImRect((ImRect *)&stack0xffffffffffffff84,&local_48,&stack0xffffffffffffff7c);
      RenderNavHighlight((ImRect *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff6c,flags);
      if (((local_6a & 1) == 0) || ((local_69 & 1) == 0)) {
        col = 7;
        if ((local_69 & 1) != 0) {
          col = 8;
        }
      }
      else {
        col = 9;
      }
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                  SUB84(in_stack_fffffffffffffed0,0));
      p_max.y = in_stack_ffffffffffffff2c;
      p_max.x = fVar2;
      RenderFrame(in_stack_ffffffffffffff30,p_max,(ImU32)((ulong)uVar5 >> 0x20),
                  SUB81((ulong)uVar5 >> 0x18,0),fVar3);
      local_a0 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                             SUB84(in_stack_fffffffffffffed0,0));
      if (((local_20->DC).ItemFlags & 0x40U) == 0) {
        if ((*local_18 & 1) != 0) {
          fVar2 = ImMax<float>(1.0,(float)(int)(local_40 / 6.0));
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff34,fVar2,fVar2);
          ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                      (ImVec2 *)0x2b00dd);
          RenderCheckMark(draw_list,pos_00,col,in_stack_ffffffffffffff00);
        }
      }
      else {
        fVar4 = 3.6;
        fVar3 = 1.0;
        fVar2 = ImMax<float>(1.0,(float)(int)(local_40 / 3.6));
        fVar3 = ImMax<float>(fVar3,(float)(int)(local_40 / fVar4));
        ImVec2::ImVec2(&local_a8,fVar2,fVar3);
        hide_text_after_hash = (undefined1)((ulong)local_20->DrawList >> 0x38);
        ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                    (ImVec2 *)0x2afffc);
        ::operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                    (ImVec2 *)0x2b0017);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(fVar4,in_stack_fffffffffffffee0),
                   &in_stack_fffffffffffffed8->Min,in_stack_fffffffffffffed0,
                   (ImU32)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                   (float)in_stack_fffffffffffffec8,id_00);
      }
      if ((local_28->LogEnabled & 1U) != 0) {
        LogRenderedText((ImVec2 *)pos_00,(char *)draw_list,
                        (char *)CONCAT44(col,in_stack_ffffffffffffff00));
      }
      if (0.0 < local_3c.x) {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff2c,local_74 + (local_30->ItemInnerSpacing).x,
                       fStack_78 + (local_30->FramePadding).y);
        RenderText(pos_00,(char *)draw_list,(char *)CONCAT44(col,in_stack_ffffffffffffff00),
                   (bool)hide_text_after_hash);
      }
      local_1 = (bool)(local_6b & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::Checkbox(const char* label, bool* v)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    const float square_sz = GetFrameHeight();
    const ImVec2 pos = window->DC.CursorPos;
    const ImRect total_bb(pos, pos + ImVec2(square_sz + (label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f), label_size.y + style.FramePadding.y * 2.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(total_bb, id, &hovered, &held);
    if (pressed)
    {
        *v = !(*v);
        MarkItemEdited(id);
    }

    const ImRect check_bb(pos, pos + ImVec2(square_sz, square_sz));
    RenderNavHighlight(total_bb, id);
    RenderFrame(check_bb.Min, check_bb.Max, GetColorU32((held && hovered) ? ImGuiCol_FrameBgActive : hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg), true, style.FrameRounding);
    ImU32 check_col = GetColorU32(ImGuiCol_CheckMark);
    if (window->DC.ItemFlags & ImGuiItemFlags_MixedValue)
    {
        // Undocumented tristate/mixed/indeterminate checkbox (#2644)
        ImVec2 pad(ImMax(1.0f, IM_FLOOR(square_sz / 3.6f)), ImMax(1.0f, IM_FLOOR(square_sz / 3.6f)));
        window->DrawList->AddRectFilled(check_bb.Min + pad, check_bb.Max - pad, check_col, style.FrameRounding);
    }
    else if (*v)
    {
        const float pad = ImMax(1.0f, IM_FLOOR(square_sz / 6.0f));
        RenderCheckMark(window->DrawList, check_bb.Min + ImVec2(pad, pad), check_col, square_sz - pad * 2.0f);
    }

    if (g.LogEnabled)
        LogRenderedText(&total_bb.Min, *v ? "[x]" : "[ ]");
    if (label_size.x > 0.0f)
        RenderText(ImVec2(check_bb.Max.x + style.ItemInnerSpacing.x, check_bb.Min.y + style.FramePadding.y), label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Checkable | (*v ? ImGuiItemStatusFlags_Checked : 0));
    return pressed;
}